

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
wasm::Builder::makeFunction
          (Name name,HeapType type,vector<wasm::Type,_std::allocator<wasm::Type>_> *vars,
          Expression *body)

{
  ulong uVar1;
  pointer pFVar2;
  __uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true> this;
  Expression *in_R9;
  Expression *body_local;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *vars_local;
  HeapType type_local;
  Name name_local;
  __single_object *func;
  
  type_local.id = name.super_IString.str._M_str;
  this.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl = name.super_IString.str._M_len;
  uVar1 = wasm::HeapType::isSignature();
  if ((uVar1 & 1) != 0) {
    std::make_unique<wasm::Function>();
    pFVar2 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                        this.
                        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                        .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
    Name::operator=((Name *)pFVar2,(Name *)&type_local);
    pFVar2 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                        this.
                        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                        .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
    (pFVar2->type).id = (uintptr_t)vars;
    pFVar2 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                        this.
                        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                        .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
    pFVar2->body = in_R9;
    pFVar2 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                        this.
                        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                        .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::swap
              (&pFVar2->vars,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)body);
    return (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
           (tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)
           this.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
           super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
  }
  __assert_fail("type.isSignature()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-builder.h"
                ,0x31,
                "static std::unique_ptr<Function> wasm::Builder::makeFunction(Name, HeapType, std::vector<Type> &&, Expression *)"
               );
}

Assistant:

static std::unique_ptr<Function> makeFunction(Name name,
                                                HeapType type,
                                                std::vector<Type>&& vars,
                                                Expression* body = nullptr) {
    assert(type.isSignature());
    auto func = std::make_unique<Function>();
    func->name = name;
    func->type = type;
    func->body = body;
    func->vars.swap(vars);
    return func;
  }